

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

bool __thiscall
cmLocalUnixMakefileGenerator3::ScanDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *targetDir,string *dependFile,
          string *internalDependFile,DependencyMap *validDeps)

{
  cmMakefile *this_00;
  bool bVar1;
  byte bVar2;
  Encoding EVar3;
  string *psVar4;
  string *topBinary;
  ostream *poVar5;
  pointer pcVar6;
  cmake *this_01;
  cmFileTimeCache *fc;
  unique_ptr<cmDependsJava,_std::default_delete<cmDependsJava>_> local_718;
  cmLocalUnixMakefileGenerator3 *local_710;
  unique_ptr<cmDependsFortran,_std::default_delete<cmDependsFortran>_> local_708;
  DependencyMap *local_700;
  cmLocalUnixMakefileGenerator3 *local_6f8;
  unique_ptr<cmDependsC,_std::default_delete<cmDependsC>_> local_6f0;
  unique_ptr<cmDepends,_std::default_delete<cmDepends>_> local_6e8;
  unique_ptr<cmDepends,_std::default_delete<cmDepends>_> scanner;
  string *lang;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_6b8;
  string_view local_698;
  undefined1 local_688 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  langs;
  cmGeneratedFileStream internalRuleFileStream;
  undefined1 local_400 [8];
  cmGeneratedFileStream ruleFileStream;
  string local_190;
  allocator<char> local_169;
  string local_168;
  cmValue local_148;
  cmValue relativePathTopBinary;
  string local_138;
  cmValue local_118;
  cmValue relativePathTopSource;
  allocator<char> local_101;
  string local_100;
  cmValue local_e0;
  cmValue force;
  cmAlphaNum local_c8;
  cmAlphaNum local_98;
  undefined1 local_68 [8];
  string dirInfoFile;
  bool haveDirectoryInfo;
  cmMakefile *mf;
  DependencyMap *validDeps_local;
  string *internalDependFile_local;
  string *dependFile_local;
  string *targetDir_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  dirInfoFile.field_2._M_local_buf[0xf] = '\0';
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmAlphaNum::cmAlphaNum(&local_98,psVar4);
  cmAlphaNum::cmAlphaNum(&local_c8,"/CMakeFiles/CMakeDirectoryInformation.cmake");
  cmStrCat<>((string *)local_68,&local_98,&local_c8);
  bVar1 = cmMakefile::ReadListFile(this_00,(string *)local_68);
  if ((bVar1) && (bVar1 = cmSystemTools::GetErrorOccurredFlag(), !bVar1)) {
    dirInfoFile.field_2._M_local_buf[0xf] = '\x01';
  }
  std::__cxx11::string::~string((string *)local_68);
  if ((dirInfoFile.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"Directory Information file not found",
               (allocator<char> *)&ruleFileStream.field_0x267);
    cmSystemTools::Error(&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&ruleFileStream.field_0x267);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"CMAKE_FORCE_UNIX_PATHS",&local_101);
    local_e0 = cmMakefile::GetDefinition(this_00,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    bVar1 = cmValue::operator_cast_to_bool(&local_e0);
    if (bVar1) {
      relativePathTopSource.Value = local_e0.Value;
      bVar1 = cmIsOff(local_e0);
      if (!bVar1) {
        cmSystemTools::SetForceUnixPaths(true);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"CMAKE_RELATIVE_PATH_TOP_SOURCE",
               (allocator<char> *)((long)&relativePathTopBinary.Value + 7));
    local_118 = cmMakefile::GetDefinition(this_00,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)((long)&relativePathTopBinary.Value + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"CMAKE_RELATIVE_PATH_TOP_BINARY",&local_169);
    local_148 = cmMakefile::GetDefinition(this_00,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    bVar1 = cmValue::operator_cast_to_bool(&local_118);
    if ((bVar1) && (bVar1 = cmValue::operator_cast_to_bool(&local_148), bVar1)) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_118);
      topBinary = cmValue::operator*[abi_cxx11_(&local_148);
      cmOutputConverter::SetRelativePathTop
                (&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,psVar4,topBinary);
    }
  }
  EVar3 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_400,dependFile,false,EVar3);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_400,true);
  bVar2 = std::ios::operator!((ios *)(local_400 + (long)*(_func_int **)((long)local_400 + -0x18)));
  if ((bVar2 & 1) == 0) {
    EVar3 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)
               &langs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,internalDependFile,false,EVar3);
    bVar2 = std::ios::operator!((ios *)((long)&langs.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       langs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].
                                       _M_string_length));
    if ((bVar2 & 1) == 0) {
      WriteDisclaimer(this,(ostream *)local_400);
      WriteDisclaimer(this,(ostream *)
                           &langs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6b8,"CMAKE_DEPENDS_LANGUAGES",
                 (allocator<char> *)((long)&__range1 + 7));
      psVar4 = cmMakefile::GetSafeDefinition(this_00,&local_6b8);
      local_698 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_688,local_698,false);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_688);
      lang = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_688);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&lang);
        if (!bVar1) break;
        scanner._M_t.super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>._M_t.
        super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>.
        super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmDepends,_std::default_delete<cmDepends>,_true,_true>)
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
        std::unique_ptr<cmDepends,std::default_delete<cmDepends>>::
        unique_ptr<std::default_delete<cmDepends>,void>
                  ((unique_ptr<cmDepends,std::default_delete<cmDepends>> *)&local_6e8);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )scanner._M_t.
                                 super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                 .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,"C");
        if (bVar1) {
LAB_007954da:
          local_700 = validDeps;
          local_6f8 = this;
          std::
          make_unique<cmDependsC,cmLocalUnixMakefileGenerator3*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>*>
                    ((cmLocalUnixMakefileGenerator3 **)&local_6f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6f8
                     ,targetDir,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      **)scanner._M_t.
                         super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>._M_t.
                         super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>.
                         super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl);
          std::unique_ptr<cmDepends,std::default_delete<cmDepends>>::operator=
                    ((unique_ptr<cmDepends,std::default_delete<cmDepends>> *)&local_6e8,&local_6f0);
          std::unique_ptr<cmDependsC,_std::default_delete<cmDependsC>_>::~unique_ptr(&local_6f0);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)scanner._M_t.
                                     super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                     .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,"CXX");
          if (bVar1) goto LAB_007954da;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)scanner._M_t.
                                     super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                     .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,"RC");
          if (bVar1) goto LAB_007954da;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)scanner._M_t.
                                     super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                     .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,"ASM");
          if (bVar1) goto LAB_007954da;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)scanner._M_t.
                                     super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                     .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,"OBJC")
          ;
          if (bVar1) goto LAB_007954da;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)scanner._M_t.
                                     super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                     .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,
                                  "OBJCXX");
          if (bVar1) goto LAB_007954da;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)scanner._M_t.
                                     super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                     .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,"CUDA")
          ;
          if (bVar1) goto LAB_007954da;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)scanner._M_t.
                                     super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                     .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,"HIP");
          if (bVar1) goto LAB_007954da;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)scanner._M_t.
                                     super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                     .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,"ISPC")
          ;
          if (bVar1) goto LAB_007954da;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)scanner._M_t.
                                     super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                     .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,
                                  "Fortran");
          if (bVar1) {
            poVar5 = std::operator<<((ostream *)local_400,
                                     "# Note that incremental build could trigger ");
            std::operator<<(poVar5,"a call to cmake_copy_f90_mod on each re-build\n");
            local_710 = this;
            std::make_unique<cmDependsFortran,cmLocalUnixMakefileGenerator3*>
                      ((cmLocalUnixMakefileGenerator3 **)&local_708);
            std::unique_ptr<cmDepends,std::default_delete<cmDepends>>::operator=
                      ((unique_ptr<cmDepends,std::default_delete<cmDepends>> *)&local_6e8,&local_708
                      );
            std::unique_ptr<cmDependsFortran,_std::default_delete<cmDependsFortran>_>::~unique_ptr
                      (&local_708);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)scanner._M_t.
                                       super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                       .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,
                                    "Java");
            if (bVar1) {
              std::make_unique<cmDependsJava>();
              std::unique_ptr<cmDepends,std::default_delete<cmDepends>>::operator=
                        ((unique_ptr<cmDepends,std::default_delete<cmDepends>> *)&local_6e8,
                         &local_718);
              std::unique_ptr<cmDependsJava,_std::default_delete<cmDependsJava>_>::~unique_ptr
                        (&local_718);
            }
          }
        }
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_6e8);
        if (bVar1) {
          pcVar6 = std::unique_ptr<cmDepends,_std::default_delete<cmDepends>_>::operator->
                             (&local_6e8);
          cmDepends::SetLocalGenerator(pcVar6,this);
          pcVar6 = std::unique_ptr<cmDepends,_std::default_delete<cmDepends>_>::operator->
                             (&local_6e8);
          this_01 = cmGlobalGenerator::GetCMakeInstance
                              ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                               GlobalGenerator);
          fc = cmake::GetFileTimeCache(this_01);
          cmDepends::SetFileTimeCache(pcVar6,fc);
          pcVar6 = std::unique_ptr<cmDepends,_std::default_delete<cmDepends>_>::operator->
                             (&local_6e8);
          cmDepends::SetLanguage
                    (pcVar6,(string *)
                            scanner._M_t.
                            super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>._M_t.
                            super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>.
                            super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl);
          pcVar6 = std::unique_ptr<cmDepends,_std::default_delete<cmDepends>_>::operator->
                             (&local_6e8);
          cmDepends::SetTargetDirectory(pcVar6,targetDir);
          pcVar6 = std::unique_ptr<cmDepends,_std::default_delete<cmDepends>_>::operator->
                             (&local_6e8);
          cmDepends::Write(pcVar6,(ostream *)local_400,
                           (ostream *)
                           &langs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::unique_ptr<cmDepends,_std::default_delete<cmDepends>_>::~unique_ptr(&local_6e8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      this_local._7_1_ = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_688);
    }
    else {
      this_local._7_1_ = false;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream
              ((cmGeneratedFileStream *)
               &langs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    this_local._7_1_ = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_400);
  return this_local._7_1_;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::ScanDependencies(
  std::string const& targetDir, std::string const& dependFile,
  std::string const& internalDependFile, cmDepends::DependencyMap& validDeps)
{
  // Read the directory information file.
  cmMakefile* mf = this->Makefile;
  bool haveDirectoryInfo = false;
  {
    std::string dirInfoFile =
      cmStrCat(this->GetCurrentBinaryDirectory(),
               "/CMakeFiles/CMakeDirectoryInformation.cmake");
    if (mf->ReadListFile(dirInfoFile) &&
        !cmSystemTools::GetErrorOccurredFlag()) {
      haveDirectoryInfo = true;
    }
  }

  // Lookup useful directory information.
  if (haveDirectoryInfo) {
    // Test whether we need to force Unix paths.
    if (cmValue force = mf->GetDefinition("CMAKE_FORCE_UNIX_PATHS")) {
      if (!cmIsOff(force)) {
        cmSystemTools::SetForceUnixPaths(true);
      }
    }

    // Setup relative path top directories.
    cmValue relativePathTopSource =
      mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_SOURCE");
    cmValue relativePathTopBinary =
      mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_BINARY");
    if (relativePathTopSource && relativePathTopBinary) {
      this->SetRelativePathTop(*relativePathTopSource, *relativePathTopBinary);
    }
  } else {
    cmSystemTools::Error("Directory Information file not found");
  }

  // Open the make depends file.  This should be copy-if-different
  // because the make tool may try to reload it needlessly otherwise.
  cmGeneratedFileStream ruleFileStream(
    dependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  ruleFileStream.SetCopyIfDifferent(true);
  if (!ruleFileStream) {
    return false;
  }

  // Open the cmake dependency tracking file.  This should not be
  // copy-if-different because dependencies are re-scanned when it is
  // older than the DependInfo.cmake.
  cmGeneratedFileStream internalRuleFileStream(
    internalDependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  if (!internalRuleFileStream) {
    return false;
  }

  this->WriteDisclaimer(ruleFileStream);
  this->WriteDisclaimer(internalRuleFileStream);

  // for each language we need to scan, scan it
  std::vector<std::string> langs =
    cmExpandedList(mf->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES"));
  for (std::string const& lang : langs) {
    // construct the checker
    // Create the scanner for this language
    std::unique_ptr<cmDepends> scanner;
    if (lang == "C" || lang == "CXX" || lang == "RC" || lang == "ASM" ||
        lang == "OBJC" || lang == "OBJCXX" || lang == "CUDA" ||
        lang == "HIP" || lang == "ISPC") {
      // TODO: Handle RC (resource files) dependencies correctly.
      scanner = cm::make_unique<cmDependsC>(this, targetDir, lang, &validDeps);
    }
#ifndef CMAKE_BOOTSTRAP
    else if (lang == "Fortran") {
      ruleFileStream << "# Note that incremental build could trigger "
                     << "a call to cmake_copy_f90_mod on each re-build\n";
      scanner = cm::make_unique<cmDependsFortran>(this);
    } else if (lang == "Java") {
      scanner = cm::make_unique<cmDependsJava>();
    }
#endif

    if (scanner) {
      scanner->SetLocalGenerator(this);
      scanner->SetFileTimeCache(
        this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache());
      scanner->SetLanguage(lang);
      scanner->SetTargetDirectory(targetDir);
      scanner->Write(ruleFileStream, internalRuleFileStream);
    }
  }

  return true;
}